

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_certificate.cc
# Opt level: O2

shared_ptr<const_bssl::ParsedCertificate> __thiscall
bssl::ParsedCertificate::Create
          (ParsedCertificate *this,UniquePtr<CRYPTO_BUFFER> *backing_data,
          ParseCertificateOptions *options,CertErrors *errors)

{
  Input extension_value;
  Input policy_constraints_tlv;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  size_t sVar2;
  undefined8 uVar3;
  bool bVar4;
  _Optional_payload_base<unsigned_char> _Var5;
  bssl *this_00;
  uchar *puVar6;
  _Optional_payload_base<bssl::SignatureAlgorithm> _Var7;
  Span<const_unsigned_char> *pSVar8;
  Input *pIVar9;
  ParsedAuthorityKeyIdentifier *pPVar10;
  ParsedTbsCertificate *pPVar11;
  ParsedExtension *pPVar12;
  ParsedAuthorityKeyIdentifier *authority_key_identifier;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t extraout_RDX_00;
  char *id;
  ParsedTbsCertificate *errors_00;
  shared_ptr<const_bssl::ParsedCertificate> sVar13;
  Input general_names_tlv;
  Input extension_value_00;
  Input certificate_tlv;
  Input tbs_tlv;
  Input tlv;
  Input name_rdn_sequence;
  Input tlv_00;
  Input name_rdn_sequence_00;
  Input extension_oid;
  Input basic_constraints_tlv;
  Input extension_oid_00;
  Input key_usage_tlv;
  Input extension_oid_01;
  Input extension_value_01;
  Input extension_oid_02;
  Input extension_oid_03;
  Input extension_oid_04;
  Input authority_info_access_tlv;
  Input extension_oid_05;
  Input extension_oid_06;
  Input extension_oid_07;
  Input policy_mappings_tlv;
  Input extension_oid_08;
  Input inhibit_any_policy_tlv;
  Input extension_oid_09;
  Input extension_value_02;
  Input extension_oid_10;
  Input extension_value_03;
  shared_ptr<bssl::ParsedCertificate> result;
  ParsedExtension extension;
  Input subject_value;
  Input issuer_value;
  CertErrors unused_errors;
  _Storage<bssl::ParsedAuthorityKeyIdentifier,_false> local_78;
  
  CertErrors::CertErrors(&unused_errors);
  if (errors == (CertErrors *)0x0) {
    errors = (CertErrors *)&unused_errors;
  }
  ::std::make_shared<bssl::ParsedCertificate,bssl::ParsedCertificate::PrivateConstructor>
            ((PrivateConstructor *)&result);
  ::std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::operator=
            ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
             result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)backing_data);
  this_00 = (bssl *)CRYPTO_BUFFER_data(((result.
                                         super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->cert_data_)._M_t.
                                       super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                       _M_head_impl);
  puVar6 = (uchar *)CRYPTO_BUFFER_len(((result.
                                        super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->cert_data_)._M_t.
                                      super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl
                                     );
  ((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cert_).
  data_.data_ = (uchar *)this_00;
  ((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cert_).
  data_.size_ = (size_t)puVar6;
  certificate_tlv.data_.size_ =
       (size_t)&(result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->tbs_certificate_tlv_;
  certificate_tlv.data_.data_ = puVar6;
  pPVar11 = (ParsedTbsCertificate *)errors;
  bVar4 = ParseCertificate(this_00,certificate_tlv,
                           &(result.
                             super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->signature_algorithm_tlv_,
                           &((result.
                              super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->signature_value_).bytes_,(BitString *)errors,
                           (CertErrors *)
                           result.
                           super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  if (bVar4) {
    tbs_tlv.data_.size_ = (size_t)options;
    tbs_tlv.data_.data_ =
         (uchar *)((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->tbs_certificate_tlv_).data_.size_;
    errors_00 = (ParsedTbsCertificate *)errors;
    bVar4 = ParseTbsCertificate((bssl *)((result.
                                          super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->tbs_certificate_tlv_).data_.data_,tbs_tlv,
                                (ParseCertificateOptions *)
                                &(result.
                                  super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->tbs_,(ParsedTbsCertificate *)errors,(CertErrors *)pPVar11
                               );
    if (bVar4) {
      _Var7 = (_Optional_payload_base<bssl::SignatureAlgorithm>)
              ParseSignatureAlgorithm
                        ((Input)((result.
                                  super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->signature_algorithm_tlv_).data_);
      ((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      signature_algorithm_).super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::SignatureAlgorithm> = _Var7;
      subject_value.data_.data_ = (uchar *)0x0;
      subject_value.data_.size_ = 0;
      tlv.data_.size_ = (size_t)&subject_value;
      tlv.data_.data_ =
           (uchar *)((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->tbs_).subject_tlv.data_.size_;
      bVar4 = anon_unknown_0::GetSequenceValue
                        ((anon_unknown_0 *)
                         ((result.
                           super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->tbs_).subject_tlv.data_.data_,tlv,
                         (Input *)result.
                                  super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      if (bVar4) {
        name_rdn_sequence.data_.size_ =
             &(result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->normalized_subject_;
        name_rdn_sequence.data_.data_ = (uchar *)subject_value.data_.size_;
        pPVar11 = (ParsedTbsCertificate *)errors;
        bVar4 = NormalizeName((bssl *)subject_value.data_.data_,name_rdn_sequence,(string *)errors,
                              (CertErrors *)errors_00);
        if (bVar4) {
          issuer_value.data_.data_ = (uchar *)0x0;
          issuer_value.data_.size_ = 0;
          tlv_00.data_.size_ = (size_t)&issuer_value;
          tlv_00.data_.data_ =
               (uchar *)((result.
                          super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->tbs_).issuer_tlv.data_.size_;
          bVar4 = anon_unknown_0::GetSequenceValue
                            ((anon_unknown_0 *)
                             ((result.
                               super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->tbs_).issuer_tlv.data_.data_,tlv_00,(Input *)pPVar11);
          if (bVar4) {
            name_rdn_sequence_00.data_.size_ =
                 &(result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->normalized_issuer_;
            name_rdn_sequence_00.data_.data_ = (uchar *)issuer_value.data_.size_;
            bVar4 = NormalizeName((bssl *)issuer_value.data_.data_,name_rdn_sequence_00,
                                  (string *)errors,(CertErrors *)errors_00);
            if (bVar4) {
              if (((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->tbs_).extensions_tlv.super__Optional_base<bssl::der::Input,_true,_true>.
                  _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged != true)
              goto LAB_003809bc;
              pSVar8 = &::std::optional<bssl::der::Input>::value
                                  (&((result.
                                      super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->tbs_).extensions_tlv)->data_;
              bVar4 = ParseExtensions((Input)*pSVar8,
                                      &(result.
                                        super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->extensions_);
              if (!bVar4) {
                CertErrors::AddError(errors,"Failed parsing extensions");
                goto LAB_003806ee;
              }
              pPVar12 = &extension;
              extension.value.data_.data_ = (uchar *)0x0;
              extension.value.data_.size_ = 0;
              extension.oid.data_.data_ = (uchar *)0x0;
              extension.oid.data_.size_ = 0;
              extension.critical = false;
              extension_oid.data_.size_ = 3;
              extension_oid.data_.data_ =
                   "U\x1d\x13U\x1d\x0fU\x1d\x11U\x1d\x1e+\x06\x01\x05\x05\a\x01\x01U\x1d$U\x1d!U\x1d\x0eU\x1d#St23_Sp_counted_ptr_inplaceIN4bssl17ParsedCertificateESaIS1_ELN9__gnu_cxx12_Lock_policyE2EE"
              ;
              bVar4 = GetExtension(result.
                                   super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,extension_oid,pPVar12);
              if (bVar4) {
                (result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->has_basic_constraints_ = true;
                basic_constraints_tlv.data_.size_ =
                     &(result.
                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->basic_constraints_;
                basic_constraints_tlv.data_.data_ = (uchar *)extension.value.data_.size_;
                bVar4 = ParseBasicConstraints
                                  ((bssl *)extension.value.data_.data_,basic_constraints_tlv,
                                   (ParsedBasicConstraints *)pPVar12);
                if (bVar4) goto LAB_003804f6;
                id = "Failed parsing basic constraints";
              }
              else {
LAB_003804f6:
                pPVar12 = &extension;
                extension_oid_00.data_.size_ = 3;
                extension_oid_00.data_.data_ =
                     "U\x1d\x0fU\x1d\x11U\x1d\x1e+\x06\x01\x05\x05\a\x01\x01U\x1d$U\x1d!U\x1d\x0eU\x1d#St23_Sp_counted_ptr_inplaceIN4bssl17ParsedCertificateESaIS1_ELN9__gnu_cxx12_Lock_policyE2EE"
                ;
                bVar4 = GetExtension(result.
                                     super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,extension_oid_00,pPVar12);
                if (bVar4) {
                  (result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->has_key_usage_ = true;
                  key_usage_tlv.data_.size_ =
                       &(result.
                         super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->key_usage_;
                  key_usage_tlv.data_.data_ = (uchar *)extension.value.data_.size_;
                  bVar4 = ParseKeyUsage((bssl *)extension.value.data_.data_,key_usage_tlv,
                                        (BitString *)pPVar12);
                  if (!bVar4) {
                    id = "Failed parsing key usage";
                    goto LAB_00380a03;
                  }
                }
                pPVar12 = &extension;
                extension_oid_01.data_.size_ = 3;
                extension_oid_01.data_.data_ = "U\x1d%U\x1d St19bad_optional_access";
                bVar4 = GetExtension(result.
                                     super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,extension_oid_01,pPVar12);
                if (bVar4) {
                  (result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->has_extended_key_usage_ = true;
                  extension_value_01.data_.size_ =
                       &(result.
                         super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->extended_key_usage_;
                  extension_value_01.data_.data_ = (uchar *)extension.value.data_.size_;
                  bVar4 = ParseEKUExtension((bssl *)extension.value.data_.data_,extension_value_01,
                                            (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                             *)pPVar12);
                  if (!bVar4) {
                    id = "Failed parsing extended key usage";
                    goto LAB_00380a03;
                  }
                }
                extension_oid_02.data_.size_ = 3;
                extension_oid_02.data_.data_ =
                     "U\x1d\x11U\x1d\x1e+\x06\x01\x05\x05\a\x01\x01U\x1d$U\x1d!U\x1d\x0eU\x1d#St23_Sp_counted_ptr_inplaceIN4bssl17ParsedCertificateESaIS1_ELN9__gnu_cxx12_Lock_policyE2EE"
                ;
                bVar4 = GetExtension(result.
                                     super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,extension_oid_02,
                                     &(result.
                                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->subject_alt_names_extension_);
                if (!bVar4) {
LAB_0038060c:
                  extension_oid_03.data_.size_ = 3;
                  extension_oid_03.data_.data_ =
                       "U\x1d\x1e+\x06\x01\x05\x05\a\x01\x01U\x1d$U\x1d!U\x1d\x0eU\x1d#St23_Sp_counted_ptr_inplaceIN4bssl17ParsedCertificateESaIS1_ELN9__gnu_cxx12_Lock_policyE2EE"
                  ;
                  bVar4 = GetExtension(result.
                                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,extension_oid_03,&extension);
                  if (bVar4) {
                    extension_value_00.data_.size_ = (size_t)extension.value.data_.data_;
                    extension_value_00.data_.data_ = (uchar *)&local_78;
                    errors_00 = (ParsedTbsCertificate *)errors;
                    NameConstraints::Create
                              (extension_value_00,SUB81(extension.value.data_.size_,0),
                               (CertErrors *)(ulong)extension.critical);
                    uVar3 = local_78._0_8_;
                    local_78._0_8_ = (pointer)0x0;
                    ::std::
                    __uniq_ptr_impl<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>
                    ::reset((__uniq_ptr_impl<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>
                             *)&(result.
                                 super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->name_constraints_,(pointer)uVar3);
                    ::std::
                    unique_ptr<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>::
                    ~unique_ptr((unique_ptr<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>
                                 *)&local_78._M_value);
                    if (((result.
                          super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->name_constraints_)._M_t.
                        super___uniq_ptr_impl<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_bssl::NameConstraints_*,_std::default_delete<bssl::NameConstraints>_>
                        .super__Head_base<0UL,_bssl::NameConstraints_*,_false>._M_head_impl ==
                        (NameConstraints *)0x0) {
                      id = "Failed parsing name constraints";
                      goto LAB_00380a03;
                    }
                  }
                  extension_oid_04.data_.size_ = 8;
                  extension_oid_04.data_.data_ =
                       "+\x06\x01\x05\x05\a\x01\x01U\x1d$U\x1d!U\x1d\x0eU\x1d#St23_Sp_counted_ptr_inplaceIN4bssl17ParsedCertificateESaIS1_ELN9__gnu_cxx12_Lock_policyE2EE"
                  ;
                  bVar4 = GetExtension(result.
                                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,extension_oid_04,
                                       &(result.
                                         super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->authority_info_access_extension_);
                  if (bVar4) {
                    (result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->has_authority_info_access_ = true;
                    authority_info_access_tlv.data_.size_ =
                         (size_t)&(result.
                                   super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->ca_issuers_uris_;
                    authority_info_access_tlv.data_.data_ =
                         (uchar *)((result.
                                    super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->authority_info_access_extension_).value.data_.size_;
                    bVar4 = ParseAuthorityInfoAccessURIs
                                      ((bssl *)((result.
                                                 super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->authority_info_access_extension_).value.
                                               data_.data_,authority_info_access_tlv,
                                       &(result.
                                         super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->ocsp_uris_,
                                       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        *)errors_00);
                    if (!bVar4) {
                      id = "Failed parsing authority info access";
                      goto LAB_00380a03;
                    }
                  }
                  extension_oid_05.data_.size_ = 3;
                  extension_oid_05.data_.data_ = "U\x1d St19bad_optional_access";
                  bVar4 = GetExtension(result.
                                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,extension_oid_05,&extension);
                  if (bVar4) {
                    (result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->has_policy_oids_ = true;
                    extension_value.data_.size_ = extension.value.data_.size_;
                    extension_value.data_.data_ = extension.value.data_.data_;
                    bVar4 = ParseCertificatePoliciesExtensionOids
                                      (extension_value,false,
                                       &(result.
                                         super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->policy_oids_,errors);
                    if (!bVar4) {
                      id = "Failed parsing certificate policies";
                      goto LAB_00380a03;
                    }
                  }
                  extension_oid_06.data_.size_ = 3;
                  extension_oid_06.data_.data_ =
                       "U\x1d$U\x1d!U\x1d\x0eU\x1d#St23_Sp_counted_ptr_inplaceIN4bssl17ParsedCertificateESaIS1_ELN9__gnu_cxx12_Lock_policyE2EE"
                  ;
                  bVar4 = GetExtension(result.
                                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,extension_oid_06,&extension);
                  if (bVar4) {
                    (result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->has_policy_constraints_ = true;
                    policy_constraints_tlv.data_.size_ = extension.value.data_.size_;
                    policy_constraints_tlv.data_.data_ = extension.value.data_.data_;
                    bVar4 = ParsePolicyConstraints
                                      (policy_constraints_tlv,
                                       &(result.
                                         super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->policy_constraints_);
                    if (!bVar4) {
                      id = "Failed parsing policy constraints";
                      goto LAB_00380a03;
                    }
                  }
                  pPVar12 = &extension;
                  extension_oid_07.data_.size_ = 3;
                  extension_oid_07.data_.data_ =
                       "U\x1d!U\x1d\x0eU\x1d#St23_Sp_counted_ptr_inplaceIN4bssl17ParsedCertificateESaIS1_ELN9__gnu_cxx12_Lock_policyE2EE"
                  ;
                  bVar4 = GetExtension(result.
                                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,extension_oid_07,pPVar12);
                  if (bVar4) {
                    (result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->has_policy_mappings_ = true;
                    policy_mappings_tlv.data_.size_ =
                         &(result.
                           super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->policy_mappings_;
                    policy_mappings_tlv.data_.data_ = (uchar *)extension.value.data_.size_;
                    bVar4 = ParsePolicyMappings((bssl *)extension.value.data_.data_,
                                                policy_mappings_tlv,
                                                (vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
                                                 *)pPVar12);
                    if (!bVar4) {
                      id = "Failed parsing policy mappings";
                      goto LAB_00380a03;
                    }
                  }
                  extension_oid_08.data_.size_ = 3;
                  extension_oid_08.data_.data_ = "U\x1d6ParserTest";
                  bVar4 = GetExtension(result.
                                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,extension_oid_08,&extension);
                  if (bVar4) {
                    inhibit_any_policy_tlv.data_.size_ = extraout_RDX_00;
                    inhibit_any_policy_tlv.data_.data_ = (uchar *)extension.value.data_.size_;
                    _Var5 = (_Optional_payload_base<unsigned_char>)
                            ParseInhibitAnyPolicy
                                      ((bssl *)extension.value.data_.data_,inhibit_any_policy_tlv);
                    ((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->inhibit_any_policy_).super__Optional_base<unsigned_char,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_char> = _Var5;
                    if (((ushort)_Var5 >> 8 & 1) == 0) {
                      id = "Failed parsing inhibit any policy";
                      goto LAB_00380a03;
                    }
                  }
                  pPVar12 = &extension;
                  extension_oid_09.data_.size_ = 3;
                  extension_oid_09.data_.data_ =
                       "U\x1d\x0eU\x1d#St23_Sp_counted_ptr_inplaceIN4bssl17ParsedCertificateESaIS1_ELN9__gnu_cxx12_Lock_policyE2EE"
                  ;
                  bVar4 = GetExtension(result.
                                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,extension_oid_09,pPVar12);
                  sVar2 = extension.value.data_.size_;
                  puVar6 = extension.value.data_.data_;
                  if (bVar4) {
                    ((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->subject_key_identifier_).
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.data_ =
                         (uchar *)0x0;
                    ((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->subject_key_identifier_).
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.size_ =
                         0;
                    ((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->subject_key_identifier_).
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged = true;
                    pIVar9 = ::std::optional<bssl::der::Input>::value
                                       (&(result.
                                          super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->subject_key_identifier_);
                    extension_value_02.data_.size_ = (size_t)pIVar9;
                    extension_value_02.data_.data_ = (uchar *)sVar2;
                    bVar4 = ParseSubjectKeyIdentifier
                                      ((bssl *)puVar6,extension_value_02,&pPVar12->oid);
                    if (!bVar4) {
                      id = "Failed parsing subject key identifier";
                      goto LAB_00380a03;
                    }
                  }
                  authority_key_identifier = (ParsedAuthorityKeyIdentifier *)&extension;
                  extension_oid_10.data_.size_ = 3;
                  extension_oid_10.data_.data_ =
                       "U\x1d#St23_Sp_counted_ptr_inplaceIN4bssl17ParsedCertificateESaIS1_ELN9__gnu_cxx12_Lock_policyE2EE"
                  ;
                  bVar4 = GetExtension(result.
                                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,extension_oid_10,
                                       (ParsedExtension *)authority_key_identifier);
                  if (bVar4) {
                    ::std::_Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier>::
                    _Optional_payload_base<>
                              ((_Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier> *)
                               &local_78);
                    ::std::_Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier>::
                    _M_move_assign((_Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier> *)
                                   &(result.
                                     super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->authority_key_identifier_,
                                   (_Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier> *)
                                   &local_78._M_value);
                    ::std::_Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier>::_M_reset
                              ((_Optional_payload_base<bssl::ParsedAuthorityKeyIdentifier> *)
                               &local_78._M_value);
                    sVar2 = extension.value.data_.size_;
                    puVar6 = extension.value.data_.data_;
                    pPVar10 = ::std::optional<bssl::ParsedAuthorityKeyIdentifier>::value
                                        (&(result.
                                           super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->authority_key_identifier_);
                    extension_value_03.data_.size_ = (size_t)pPVar10;
                    extension_value_03.data_.data_ = (uchar *)sVar2;
                    bVar4 = ParseAuthorityKeyIdentifier
                                      ((bssl *)puVar6,extension_value_03,authority_key_identifier);
                    if (!bVar4) {
                      id = "Failed parsing authority key identifier";
                      goto LAB_00380a03;
                    }
                  }
LAB_003809bc:
                  _Var1._M_pi = result.
                                super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                  (this->cert_data_)._M_t.
                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
                       (crypto_buffer_st *)
                       result.
                       super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
                  result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  (this->cert_).data_.data_ = (uchar *)_Var1._M_pi;
                  result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  goto LAB_003806f4;
                }
                general_names_tlv.data_.size_ =
                     (size_t)((result.
                               super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->subject_alt_names_extension_).value.data_.data_;
                general_names_tlv.data_.data_ = (uchar *)&local_78;
                GeneralNames::Create
                          (general_names_tlv,
                           (CertErrors *)
                           ((result.
                             super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->subject_alt_names_extension_).value.data_.size_);
                uVar3 = local_78._0_8_;
                local_78._0_8_ = (pointer)0x0;
                ::std::__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                ::reset((__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                         *)&(result.
                             super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->subject_alt_names_,(pointer)uVar3);
                ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
                ~unique_ptr((unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                             *)&local_78._M_value);
                if (((result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->subject_alt_names_)._M_t.
                    super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                    .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl ==
                    (GeneralNames *)0x0) {
                  id = "Failed parsing subjectAltName";
                }
                else {
                  if ((subject_value.data_.size_ != 0) ||
                     (((result.
                        super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->subject_alt_names_extension_).critical == true)) goto LAB_0038060c;
                  id = "Empty subject and subjectAltName is not critical";
                }
              }
LAB_00380a03:
              CertErrors::AddError(errors,id);
            }
            else {
              CertErrors::AddError(errors,"Failed normalizing issuer");
            }
          }
          else {
            CertErrors::AddError(errors,"Failed reading issuer or subject");
          }
        }
        else {
          CertErrors::AddError(errors,"Failed normalizing subject");
        }
      }
      else {
        CertErrors::AddError(errors,"Failed reading issuer or subject");
      }
    }
    else {
      CertErrors::AddError(errors,"Failed parsing TBSCertificate");
    }
  }
  else {
    CertErrors::AddError(errors,"Failed parsing Certificate");
  }
LAB_003806ee:
  (this->cert_data_)._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl = (crypto_buffer_st *)0x0;
  (this->cert_).data_.data_ = (uchar *)0x0;
LAB_003806f4:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CertErrors::~CertErrors(&unused_errors);
  sVar13.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar13.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (shared_ptr<const_bssl::ParsedCertificate>)
         sVar13.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const ParsedCertificate> ParsedCertificate::Create(
    bssl::UniquePtr<CRYPTO_BUFFER> backing_data,
    const ParseCertificateOptions &options, CertErrors *errors) {
  // |errors| is an optional parameter, but to keep the code simpler, use a
  // dummy object when one wasn't provided.
  CertErrors unused_errors;
  if (!errors) {
    errors = &unused_errors;
  }

  auto result = std::make_shared<ParsedCertificate>(PrivateConstructor{});
  result->cert_data_ = std::move(backing_data);
  result->cert_ = der::Input(CRYPTO_BUFFER_data(result->cert_data_.get()),
                             CRYPTO_BUFFER_len(result->cert_data_.get()));

  if (!ParseCertificate(result->cert_, &result->tbs_certificate_tlv_,
                        &result->signature_algorithm_tlv_,
                        &result->signature_value_, errors)) {
    errors->AddError(kFailedParsingCertificate);
    return nullptr;
  }

  if (!ParseTbsCertificate(result->tbs_certificate_tlv_, options, &result->tbs_,
                           errors)) {
    errors->AddError(kFailedParsingTbsCertificate);
    return nullptr;
  }

  // Attempt to parse the signature algorithm contained in the Certificate.
  result->signature_algorithm_ =
      ParseSignatureAlgorithm(result->signature_algorithm_tlv_);

  der::Input subject_value;
  if (!GetSequenceValue(result->tbs_.subject_tlv, &subject_value)) {
    errors->AddError(kFailedReadingIssuerOrSubject);
    return nullptr;
  }
  if (!NormalizeName(subject_value, &result->normalized_subject_, errors)) {
    errors->AddError(kFailedNormalizingSubject);
    return nullptr;
  }
  der::Input issuer_value;
  if (!GetSequenceValue(result->tbs_.issuer_tlv, &issuer_value)) {
    errors->AddError(kFailedReadingIssuerOrSubject);
    return nullptr;
  }
  if (!NormalizeName(issuer_value, &result->normalized_issuer_, errors)) {
    errors->AddError(kFailedNormalizingIssuer);
    return nullptr;
  }

  // Parse the standard X.509 extensions.
  if (result->tbs_.extensions_tlv) {
    // ParseExtensions() ensures there are no duplicates, and maps the (unique)
    // OID to the extension value.
    if (!ParseExtensions(result->tbs_.extensions_tlv.value(),
                         &result->extensions_)) {
      errors->AddError(kFailedParsingExtensions);
      return nullptr;
    }

    ParsedExtension extension;

    // Basic constraints.
    if (result->GetExtension(der::Input(kBasicConstraintsOid), &extension)) {
      result->has_basic_constraints_ = true;
      if (!ParseBasicConstraints(extension.value,
                                 &result->basic_constraints_)) {
        errors->AddError(kFailedParsingBasicConstraints);
        return nullptr;
      }
    }

    // Key Usage.
    if (result->GetExtension(der::Input(kKeyUsageOid), &extension)) {
      result->has_key_usage_ = true;
      if (!ParseKeyUsage(extension.value, &result->key_usage_)) {
        errors->AddError(kFailedParsingKeyUsage);
        return nullptr;
      }
    }

    // Extended Key Usage.
    if (result->GetExtension(der::Input(kExtKeyUsageOid), &extension)) {
      result->has_extended_key_usage_ = true;
      if (!ParseEKUExtension(extension.value, &result->extended_key_usage_)) {
        errors->AddError(kFailedParsingEku);
        return nullptr;
      }
    }

    // Subject alternative name.
    if (result->GetExtension(der::Input(kSubjectAltNameOid),
                             &result->subject_alt_names_extension_)) {
      // RFC 5280 section 4.2.1.6:
      // SubjectAltName ::= GeneralNames
      result->subject_alt_names_ = GeneralNames::Create(
          result->subject_alt_names_extension_.value, errors);
      if (!result->subject_alt_names_) {
        errors->AddError(kFailedParsingSubjectAltName);
        return nullptr;
      }
      // RFC 5280 section 4.1.2.6:
      // If subject naming information is present only in the subjectAltName
      // extension (e.g., a key bound only to an email address or URI), then the
      // subject name MUST be an empty sequence and the subjectAltName extension
      // MUST be critical.
      if (subject_value.empty() &&
          !result->subject_alt_names_extension_.critical) {
        errors->AddError(kSubjectAltNameNotCritical);
        return nullptr;
      }
    }

    // Name constraints.
    if (result->GetExtension(der::Input(kNameConstraintsOid), &extension)) {
      result->name_constraints_ =
          NameConstraints::Create(extension.value, extension.critical, errors);
      if (!result->name_constraints_) {
        errors->AddError(kFailedParsingNameConstraints);
        return nullptr;
      }
    }

    // Authority information access.
    if (result->GetExtension(der::Input(kAuthorityInfoAccessOid),
                             &result->authority_info_access_extension_)) {
      result->has_authority_info_access_ = true;
      if (!ParseAuthorityInfoAccessURIs(
              result->authority_info_access_extension_.value,
              &result->ca_issuers_uris_, &result->ocsp_uris_)) {
        errors->AddError(kFailedParsingAia);
        return nullptr;
      }
    }

    // Policies.
    if (result->GetExtension(der::Input(kCertificatePoliciesOid), &extension)) {
      result->has_policy_oids_ = true;
      if (!ParseCertificatePoliciesExtensionOids(
              extension.value, false /*fail_parsing_unknown_qualifier_oids*/,
              &result->policy_oids_, errors)) {
        errors->AddError(kFailedParsingPolicies);
        return nullptr;
      }
    }

    // Policy constraints.
    if (result->GetExtension(der::Input(kPolicyConstraintsOid), &extension)) {
      result->has_policy_constraints_ = true;
      if (!ParsePolicyConstraints(extension.value,
                                  &result->policy_constraints_)) {
        errors->AddError(kFailedParsingPolicyConstraints);
        return nullptr;
      }
    }

    // Policy mappings.
    if (result->GetExtension(der::Input(kPolicyMappingsOid), &extension)) {
      result->has_policy_mappings_ = true;
      if (!ParsePolicyMappings(extension.value, &result->policy_mappings_)) {
        errors->AddError(kFailedParsingPolicyMappings);
        return nullptr;
      }
    }

    // Inhibit Any Policy.
    if (result->GetExtension(der::Input(kInhibitAnyPolicyOid), &extension)) {
      result->inhibit_any_policy_ = ParseInhibitAnyPolicy(extension.value);
      if (!result->inhibit_any_policy_) {
        errors->AddError(kFailedParsingInhibitAnyPolicy);
        return nullptr;
      }
    }

    // Subject Key Identifier.
    if (result->GetExtension(der::Input(kSubjectKeyIdentifierOid),
                             &extension)) {
      result->subject_key_identifier_ = std::make_optional<der::Input>();
      if (!ParseSubjectKeyIdentifier(
              extension.value, &result->subject_key_identifier_.value())) {
        errors->AddError(kFailedParsingSubjectKeyIdentifier);
        return nullptr;
      }
    }

    // Authority Key Identifier.
    if (result->GetExtension(der::Input(kAuthorityKeyIdentifierOid),
                             &extension)) {
      result->authority_key_identifier_ =
          std::make_optional<ParsedAuthorityKeyIdentifier>();
      if (!ParseAuthorityKeyIdentifier(
              extension.value, &result->authority_key_identifier_.value())) {
        errors->AddError(kFailedParsingAuthorityKeyIdentifier);
        return nullptr;
      }
    }
  }

  return result;
}